

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::
write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,wchar_t>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,decimal_fp<float> *fp,
          basic_format_specs<wchar_t> *specs,float_specs fspecs,locale_ref loc)

{
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar1;
  basic_format_specs<wchar_t> *specs_local;
  decimal_fp<float> *fp_local;
  locale_ref loc_local;
  float_specs fspecs_local;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out_local;
  
  bVar1 = do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,wchar_t,fmt::v8::detail::digit_grouping<wchar_t>>
                    (out,fp,specs,fspecs,loc);
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_float(OutputIt out, const DecimalFP& fp,
                                 const basic_format_specs<Char>& specs,
                                 float_specs fspecs, locale_ref loc)
    -> OutputIt {
  if (is_constant_evaluated()) {
    return do_write_float<OutputIt, DecimalFP, Char,
                          fallback_digit_grouping<Char>>(out, fp, specs, fspecs,
                                                         loc);
  } else {
    return do_write_float(out, fp, specs, fspecs, loc);
  }
}